

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsystem_netconf.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int __fd;
  in_addr_t iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  LIBSSH2_CHANNEL *channel;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  FILE *pFVar11;
  byte bVar12;
  long lVar13;
  bool bVar14;
  ssize_t len;
  sockaddr_in sin;
  char buf [1048576];
  size_t in_stack_ffffffffffefffb0;
  
  if (1 < argc) {
    server_ip = argv[1];
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  uVar1 = libssh2_init(0);
  if (uVar1 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
    return 1;
  }
  __fd = socket(2,1,6);
  if (__fd == -1) {
    main_cold_10();
  }
  else {
    iVar2 = inet_addr(server_ip);
    if (iVar2 == 0xffffffff) {
      main_cold_9();
    }
    else {
      iVar3 = connect(__fd,(sockaddr *)&stack0xffffffffffefffb8,0x10);
      if (iVar3 == 0) {
        lVar4 = libssh2_session_init_ex(0,0,0,0);
        if (lVar4 != 0) {
          uVar1 = libssh2_session_handshake(lVar4,__fd);
          if (uVar1 != 0) {
            channel = (LIBSSH2_CHANNEL *)0x0;
            fprintf(_stderr,"Error when starting up SSH session: %d\n",(ulong)uVar1);
            goto LAB_0010155d;
          }
          lVar5 = libssh2_hostkey_hash(lVar4,2);
          fwrite("Fingerprint: ",0xd,1,_stderr);
          lVar13 = 0;
          do {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + lVar13));
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x14);
          fputc(10,_stderr);
          pcVar7 = username;
          sVar6 = strlen(username);
          pcVar7 = (char *)libssh2_userauth_list(lVar4,pcVar7,sVar6 & 0xffffffff);
          if (pcVar7 == (char *)0x0) {
LAB_0010166c:
            channel = (LIBSSH2_CHANNEL *)
                      libssh2_channel_open_ex(lVar4,"session",7,0x200000,0x8000,0);
            if (channel != (LIBSSH2_CHANNEL *)0x0) {
              iVar3 = libssh2_channel_process_startup(channel,"subsystem",9,"netconf",7);
              if (iVar3 == 0) {
                fwrite("Sending NETCONF client <hello>\n",0x1f,1,_stderr);
                snprintf(&stack0xffffffffffefffc8,0x100000,
                         "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<hello><capabilities><capability>urn:ietf:params:xml:ns:netconf:base:1.0</capability></capabilities></hello>\n]]>]]>\n%n"
                         ,&stack0xffffffffffefffb0);
                iVar3 = netconf_write(channel,&stack0xffffffffffefffc8,in_stack_ffffffffffefffb0);
                if (iVar3 != -1) {
                  pFVar11 = _stderr;
                  fwrite("Reading NETCONF server <hello>\n",0x1f,1,_stderr);
                  uVar9 = netconf_read_until(channel,"</hello>",&stack0xffffffffffefffc8,
                                             (size_t)pFVar11);
                  if (uVar9 != 0xffffffffffffffff) {
                    fprintf(_stderr,"Got %d bytes:\n----------------------\n%s",uVar9 & 0xffffffff,
                            &stack0xffffffffffefffc8);
                    fwrite("Sending NETCONF <rpc>\n",0x16,1,_stderr);
                    snprintf(&stack0xffffffffffefffc8,0x100000,
                             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<rpc xmlns=\"urn:ietf:params:xml:ns:netconf:base:1.0\"><get-interface-information><terse/></get-interface-information></rpc>\n]]>]]>\n%n"
                             ,&stack0xffffffffffefffb0);
                    iVar3 = netconf_write(channel,&stack0xffffffffffefffc8,uVar9);
                    if (iVar3 != -1) {
                      pFVar11 = _stderr;
                      fwrite("Reading NETCONF <rpc-reply>\n",0x1c,1,_stderr);
                      uVar9 = netconf_read_until(channel,"</rpc-reply>",&stack0xffffffffffefffc8,
                                                 (size_t)pFVar11);
                      if (uVar9 != 0xffffffffffffffff) {
                        fprintf(_stderr,"Got %d bytes:\n----------------------\n%s",
                                uVar9 & 0xffffffff,&stack0xffffffffffefffc8);
                      }
                    }
                  }
                }
              }
              else {
                main_cold_6();
              }
              goto LAB_0010155d;
            }
            main_cold_7();
          }
          else {
            fprintf(_stderr,"Authentication methods: %s\n",pcVar7);
            pcVar8 = strstr(pcVar7,"password");
            bVar14 = pcVar8 != (char *)0x0;
            pcVar7 = strstr(pcVar7,"publickey");
            bVar12 = bVar14 + 2;
            if (pcVar7 == (char *)0x0) {
              bVar12 = bVar14;
            }
            if (4 < argc) {
              if (pcVar8 != (char *)0x0) {
                iVar3 = strcmp(argv[4],"-p");
                if (iVar3 == 0) {
                  bVar12 = 0;
                  bVar14 = true;
                }
              }
              if ((bVar12 & 2) != 0) {
                iVar3 = strcmp(argv[4],"-k");
                if (iVar3 == 0) {
                  bVar12 = 2;
                  bVar14 = false;
                }
              }
            }
            pcVar7 = username;
            if (bVar14) {
              sVar6 = strlen(username);
              pcVar8 = password;
              sVar10 = strlen(password);
              iVar3 = libssh2_userauth_password_ex
                                (lVar4,pcVar7,sVar6 & 0xffffffff,pcVar8,sVar10 & 0xffffffff,0);
              if (iVar3 == 0) goto LAB_0010166c;
              main_cold_2();
            }
            else if ((bVar12 & 2) == 0) {
              main_cold_5();
            }
            else {
              sVar6 = strlen(username);
              iVar3 = libssh2_userauth_publickey_fromfile_ex
                                (lVar4,pcVar7,sVar6 & 0xffffffff,"/home/username/.ssh/id_rsa.pub",
                                 "/home/username/.ssh/id_rsa",password);
              if (iVar3 == 0) {
                main_cold_4();
                goto LAB_0010166c;
              }
              main_cold_3();
            }
          }
          channel = (LIBSSH2_CHANNEL *)0x0;
          goto LAB_0010155d;
        }
        main_cold_8();
      }
      else {
        main_cold_1();
      }
    }
  }
  lVar4 = 0;
  channel = (LIBSSH2_CHANNEL *)0x0;
LAB_0010155d:
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    libssh2_channel_free(channel);
  }
  if (lVar4 != 0) {
    libssh2_session_disconnect_ex(lVar4,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar4);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    int i, auth = AUTH_NONE;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel = NULL;
    char buf[1048576]; /* avoid any buffer reallocation for simplicity */
    ssize_t len;
    libssh2_socket_t sock;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1)
        server_ip = argv[1];
    if(argc > 2)
        username = argv[2];
    if(argc > 3)
        password = argv[3];

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Connect to SSH server */
    sock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_addr.s_addr = inet_addr(server_ip);
    if(INADDR_NONE == sin.sin_addr.s_addr) {
        fprintf(stderr, "inet_addr: Invalid IP address \"%s\"\n", server_ip);
        goto shutdown;
    }
    sin.sin_port = htons(830);
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "Failed to connect to %s!\n", inet_ntoa(sin.sin_addr));
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Error when starting up SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++)
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password"))
            auth |= AUTH_PASSWORD;
        if(strstr(userauthlist, "publickey"))
            auth |= AUTH_PUBLICKEY;

        /* check for options */
        if(argc > 4) {
            if((auth & AUTH_PASSWORD) && !strcmp(argv[4], "-p"))
                auth = AUTH_PASSWORD;
            if((auth & AUTH_PUBLICKEY) && !strcmp(argv[4], "-k"))
                auth = AUTH_PUBLICKEY;
        }

        if(auth & AUTH_PASSWORD) {
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed!\n");
                goto shutdown;
            }
        }
        else if(auth & AUTH_PUBLICKEY) {
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed!\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found!\n");
            goto shutdown;
        }
    }

    /* open a channel */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Could not open the channel!\n"
                        "(Note that this can be a problem at the server!"
                       " Please review the server logs.)\n");
        goto shutdown;
    }

    /* execute the subsystem on our channel */
    if(libssh2_channel_subsystem(channel, "netconf")) {
        fprintf(stderr, "Could not execute the \"netconf\" subsystem!\n"
                        "(Note that this can be a problem at the server!"
                        " Please review the server logs.)\n");
        goto shutdown;
    }

    /* NETCONF: https://tools.ietf.org/html/draft-ietf-netconf-ssh-06 */

    fprintf(stderr, "Sending NETCONF client <hello>\n");
    snprintf(buf, sizeof(buf),
      "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
      "<hello>"
      "<capabilities>"
      "<capability>urn:ietf:params:xml:ns:netconf:base:1.0</capability>"
      "</capabilities>"
      "</hello>\n"
      "]]>]]>\n%n", (int *)&len);
    if(-1 == netconf_write(channel, buf, len))
        goto shutdown;

    fprintf(stderr, "Reading NETCONF server <hello>\n");
    len = netconf_read_until(channel, "</hello>", buf, sizeof(buf));
    if(-1 == len)
        goto shutdown;

    fprintf(stderr, "Got %d bytes:\n----------------------\n%s",
            (int)len, buf);

    fprintf(stderr, "Sending NETCONF <rpc>\n");
    snprintf(buf, sizeof(buf),
      "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
      "<rpc xmlns=\"urn:ietf:params:xml:ns:netconf:base:1.0\">"
      "<get-interface-information><terse/></get-interface-information>"
      "</rpc>\n"
      "]]>]]>\n%n", (int *)&len);
    if(-1 == netconf_write(channel, buf, len))
        goto shutdown;

    fprintf(stderr, "Reading NETCONF <rpc-reply>\n");
    len = netconf_read_until(channel, "</rpc-reply>", buf, sizeof(buf));
    if(-1 == len)
        goto shutdown;

    fprintf(stderr, "Got %d bytes:\n----------------------\n%s",
            (int)len, buf);

shutdown:

    if(channel)
        libssh2_channel_free(channel);

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    libssh2_exit();

    return 0;
}